

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O3

void __thiscall
TPZReducedSpace::ShapeX(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data)

{
  TPZInterpolationSpace *this_00;
  int64_t newRows;
  TPZFNMatrix<30,_double> *pTVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  TPZMaterialDataT<double> inteldata;
  long local_82b8;
  long local_82b0;
  long local_8288;
  TPZMaterialDataT<double> local_8260;
  
  this_00 = this->fReferred;
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
  local_8260.super_TPZMaterialData.fNeedsSol = true;
  TPZInterpolationSpace::ComputeSolution(this_00,qsi,&local_8260,false);
  TPZManVector<TPZManVector<double,_10>,_20>::operator=
            (&data->sol,(TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0U))
  ;
  TPZManVector<TPZFNMatrix<30,_double>,_20>::operator=
            (&data->dsol,(TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0U))
  ;
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018c0eb8;
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7950));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7070));
  TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
            ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0U));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0U));
  TPZMaterialData::~TPZMaterialData(&local_8260.super_TPZMaterialData,&PTR_PTR_018c0f20);
  newRows = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fNElements;
  uVar5 = (data->super_TPZMaterialData).axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  uVar4 = (uint)(((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>)
                .fNElements;
  TPZFMatrix<double>::Resize
            (&(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,newRows,(long)(int)uVar4);
  iVar7 = (int)uVar5;
  TPZFMatrix<double>::Resize
            (&(data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>,
             (long)(int)(uVar4 * iVar7),newRows);
  if (0 < newRows) {
    uVar5 = uVar5 & 0xffffffff;
    local_8288 = 0;
    local_82b8 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar8 = 0;
        local_82b0 = 0;
        uVar10 = 0;
        do {
          lVar6 = (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.super_TPZMatrix<double>
                  .super_TPZBaseMatrix.fRow;
          if ((lVar6 <= local_82b8) ||
             ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol <= (long)uVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem
          [lVar6 * uVar10 + local_82b8] =
               (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_82b8].
               super_TPZVec<double>.fStore[uVar10];
          if (0 < iVar7) {
            uVar9 = 0;
            lVar6 = local_82b0;
            do {
              pTVar1 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
              lVar2 = pTVar1[local_82b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow;
              if ((lVar2 <= (long)uVar9) ||
                 (pTVar1[local_82b8].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fCol <= (long)uVar10)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar3 = (data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                      super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
              if ((lVar3 <= lVar6) ||
                 ((data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                  super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_82b8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(undefined8 *)
               ((long)(data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.fElem +
               lVar6 * 8 + lVar3 * local_8288) =
                   *(undefined8 *)
                    ((long)pTVar1[local_82b8].super_TPZFMatrix<double>.fElem +
                    uVar9 * 8 + lVar2 * lVar8);
              uVar9 = uVar9 + 1;
              lVar6 = lVar6 + 1;
            } while (uVar5 != uVar9);
          }
          uVar10 = uVar10 + 1;
          local_82b0 = local_82b0 + uVar5;
          lVar8 = lVar8 + 8;
        } while (uVar10 != (uVar4 & 0x7fffffff));
      }
      local_82b8 = local_82b8 + 1;
      local_8288 = local_8288 + 8;
    } while (local_82b8 != newRows);
  }
  return;
}

Assistant:

void TPZReducedSpace::ShapeX(TPZVec<REAL> &qsi,TPZMaterialDataT<STATE> &data)
{
    TPZInterpolationSpace *intel = ReferredIntel();

    {
        TPZMaterialDataT<STATE> inteldata;
        inteldata.fNeedsSol=true;
        constexpr bool hasPhi{false};
        intel->ComputeSolution(qsi,inteldata,hasPhi);
        data.sol = std::move(inteldata.sol);
        data.dsol = std::move(inteldata.dsol);
    }
    int64_t nsol = data.sol.size();
    int nstate = data.sol[0].size();
    int dim = data.axes.Rows();
    data.phi.Resize(nsol,nstate);
    data.dphix.Resize(nstate*dim,nsol);
    for (int64_t isol =0; isol<nsol; isol++) {
        for (int istate=0; istate<nstate; istate++) {
            data.phi(isol,istate) = data.sol[isol][istate];
            for (int id=0; id<dim; id++) {
                data.dphix(id+istate*dim,isol) = data.dsol[isol](id,istate);
            }
        }
    }
}